

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<int> *
testing::internal::ActionResultHolder<int>::
PerformAction<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>
          (Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
           *action,ArgumentTuple *args)

{
  Result RVar1;
  ActionResultHolder<int> *pAVar2;
  _Head_base<0UL,_const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_false>
  local_20;
  
  pAVar2 = (ActionResultHolder<int> *)operator_new(0x10);
  local_20._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
       ).
       super__Head_base<0UL,_const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_false>
       ._M_head_impl;
  RVar1 = Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
          ::Perform(action,(ArgumentTuple *)&local_20);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002f51c8;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }